

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_lower_upper_factorisation.hpp
# Opt level: O2

void __thiscall
Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>::
Direct_Lower_Upper_Factorisation
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *this,
          Solver_Config config)

{
  initialise_solver(this,config);
  this->factorised = false;
  this->factorisation_tolerance = 1.4210854715202004e-14;
  (this->lu_factorised).
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lu_factorised).
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lu_factorised).
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pivots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pivots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pivots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initialise_solver(this,config);
  return;
}

Assistant:

explicit Direct_Lower_Upper_Factorisation(Solver_Config config)
      : Direct<Direct_Lower_Upper_Factorisation<_solver_type, _size, _pivot>, _size>(config) {
    initialise_solver(config);
  }